

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint __thiscall llvm::dwarf::getOperationEncoding(dwarf *this,StringRef OperationEncodingString)

{
  StringRef S;
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringRef local_b10;
  StringRef local_b00;
  StringRef local_af0;
  StringRef local_ae0;
  StringRef local_ad0;
  StringRef local_ac0;
  StringRef local_ab0;
  StringRef local_aa0;
  StringRef local_a90;
  StringRef local_a80;
  StringRef local_a70;
  StringRef local_a60;
  StringRef local_a50;
  StringRef local_a40;
  StringRef local_a30;
  StringRef local_a20;
  StringRef local_a10;
  StringRef local_a00;
  StringRef local_9f0;
  StringRef local_9e0;
  StringRef local_9d0;
  StringRef local_9c0;
  StringRef local_9b0;
  StringRef local_9a0;
  StringRef local_990;
  StringRef local_980;
  StringRef local_970;
  StringRef local_960;
  StringRef local_950;
  StringRef local_940;
  StringRef local_930;
  StringRef local_920;
  StringRef local_910;
  StringRef local_900;
  StringRef local_8f0;
  StringRef local_8e0;
  StringRef local_8d0;
  StringRef local_8c0;
  StringRef local_8b0;
  StringRef local_8a0;
  StringRef local_890;
  StringRef local_880;
  StringRef local_870;
  StringRef local_860;
  StringRef local_850;
  StringRef local_840;
  StringRef local_830;
  StringRef local_820;
  StringRef local_810;
  StringRef local_800;
  StringRef local_7f0;
  StringRef local_7e0;
  StringRef local_7d0;
  StringRef local_7c0;
  StringRef local_7b0;
  StringRef local_7a0;
  StringRef local_790;
  StringRef local_780;
  StringRef local_770;
  StringRef local_760;
  StringRef local_750;
  StringRef local_740;
  StringRef local_730;
  StringRef local_720;
  StringRef local_710;
  StringRef local_700;
  StringRef local_6f0;
  StringRef local_6e0;
  StringRef local_6d0;
  StringRef local_6c0;
  StringRef local_6b0;
  StringRef local_6a0;
  StringRef local_690;
  StringRef local_680;
  StringRef local_670;
  StringRef local_660;
  StringRef local_650;
  StringRef local_640;
  StringRef local_630;
  StringRef local_620;
  StringRef local_610;
  StringRef local_600;
  StringRef local_5f0;
  StringRef local_5e0;
  StringRef local_5d0;
  StringRef local_5c0;
  StringRef local_5b0;
  StringRef local_5a0;
  StringRef local_590;
  StringRef local_580;
  StringRef local_570;
  StringRef local_560;
  StringRef local_550;
  StringRef local_540;
  StringRef local_530;
  StringRef local_520;
  StringRef local_510;
  StringRef local_500;
  StringRef local_4f0;
  StringRef local_4e0;
  StringRef local_4d0;
  StringRef local_4c0;
  StringRef local_4b0;
  StringRef local_4a0;
  StringRef local_490;
  StringRef local_480;
  StringRef local_470;
  StringRef local_460;
  StringRef local_450;
  StringRef local_440;
  StringRef local_430;
  StringRef local_420;
  StringRef local_410;
  StringRef local_400;
  StringRef local_3f0;
  StringRef local_3e0;
  StringRef local_3d0;
  StringRef local_3c0;
  StringRef local_3b0;
  StringRef local_3a0;
  StringRef local_390;
  StringRef local_380;
  StringRef local_370;
  StringRef local_360;
  StringRef local_350;
  StringRef local_340;
  StringRef local_330;
  StringRef local_320;
  StringRef local_310;
  StringRef local_300;
  StringRef local_2f0;
  StringRef local_2e0;
  StringRef local_2d0;
  StringRef local_2c0;
  StringRef local_2b0;
  StringRef local_2a0;
  StringRef local_290;
  StringRef local_280;
  StringRef local_270;
  StringRef local_260;
  StringRef local_250;
  StringRef local_240;
  StringRef local_230;
  StringRef local_220;
  StringRef local_210;
  StringRef local_200;
  StringRef local_1f0;
  StringRef local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  StringRef local_1b0;
  StringRef local_1a0;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  dwarf *local_40;
  char *local_38;
  StringSwitch<unsigned_int,_unsigned_int> local_30;
  dwarf *local_18;
  StringRef OperationEncodingString_local;
  
  local_38 = OperationEncodingString.Data;
  S.Length = (size_t)local_38;
  S.Data = (char *)this;
  local_40 = this;
  local_18 = this;
  OperationEncodingString_local.Data = local_38;
  StringSwitch<unsigned_int,_unsigned_int>::StringSwitch(&local_30,S);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_50,(char (*) [11])"DW_OP_addr");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_30,(StringLiteral)local_50,3);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_60,(char (*) [12])"DW_OP_deref");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_60,6);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_70,(char (*) [14])"DW_OP_const1u");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_70,8);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_80,(char (*) [14])"DW_OP_const1s");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_80,9);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_90,(char (*) [14])"DW_OP_const2u");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_90,10);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_a0,(char (*) [14])"DW_OP_const2s");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a0,0xb);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_b0,(char (*) [14])"DW_OP_const4u");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_b0,0xc);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_c0,(char (*) [14])"DW_OP_const4s");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_c0,0xd);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_d0,(char (*) [14])"DW_OP_const8u");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_d0,0xe);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_e0,(char (*) [14])"DW_OP_const8s");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_e0,0xf);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_f0,(char (*) [13])"DW_OP_constu");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_f0,0x10);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_100,(char (*) [13])"DW_OP_consts");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_100,0x11);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_110,(char (*) [10])"DW_OP_dup");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_110,0x12);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_120,(char (*) [11])"DW_OP_drop");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_120,0x13);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_130,(char (*) [11])"DW_OP_over");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_130,0x14);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_140,(char (*) [11])"DW_OP_pick");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_140,0x15);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_150,(char (*) [11])"DW_OP_swap");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_150,0x16);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_160,(char (*) [10])"DW_OP_rot");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_160,0x17);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_170,(char (*) [13])"DW_OP_xderef");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_170,0x18);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_180,(char (*) [10])"DW_OP_abs");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_180,0x19);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_190,(char (*) [10])"DW_OP_and");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_190,0x1a);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_1a0,(char (*) [10])"DW_OP_div");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1a0,0x1b);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_1b0,(char (*) [12])"DW_OP_minus");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1b0,0x1c);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_1c0,(char (*) [10])"DW_OP_mod");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1c0,0x1d);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_1d0,(char (*) [10])"DW_OP_mul");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1d0,0x1e);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_1e0,(char (*) [10])"DW_OP_neg");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1e0,0x1f);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_1f0,(char (*) [10])"DW_OP_not");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1f0,0x20);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_200,(char (*) [9])"DW_OP_or");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_200,0x21);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_210,(char (*) [11])"DW_OP_plus");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_210,0x22);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_220,(char (*) [18])"DW_OP_plus_uconst")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_220,0x23);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_230,(char (*) [10])"DW_OP_shl");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_230,0x24);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_240,(char (*) [10])"DW_OP_shr");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_240,0x25);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_250,(char (*) [11])"DW_OP_shra");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_250,0x26);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_260,(char (*) [10])"DW_OP_xor");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_260,0x27);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_270,(char (*) [10])"DW_OP_bra");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_270,0x28);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_280,(char (*) [9])"DW_OP_eq");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_280,0x29);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_290,(char (*) [9])"DW_OP_ge");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_290,0x2a);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_2a0,(char (*) [9])"DW_OP_gt");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2a0,0x2b);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_2b0,(char (*) [9])"DW_OP_le");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2b0,0x2c);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_2c0,(char (*) [9])"DW_OP_lt");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2c0,0x2d);
  StringLiteral::StringLiteral<9UL>((StringLiteral *)&local_2d0,(char (*) [9])"DW_OP_ne");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2d0,0x2e);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_2e0,(char (*) [11])"DW_OP_skip");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2e0,0x2f);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_2f0,(char (*) [11])"DW_OP_lit0");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2f0,0x30);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_300,(char (*) [11])"DW_OP_lit1");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_300,0x31);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_310,(char (*) [11])"DW_OP_lit2");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_310,0x32);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_320,(char (*) [11])"DW_OP_lit3");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_320,0x33);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_330,(char (*) [11])"DW_OP_lit4");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_330,0x34);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_340,(char (*) [11])"DW_OP_lit5");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_340,0x35);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_350,(char (*) [11])"DW_OP_lit6");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_350,0x36);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_360,(char (*) [11])"DW_OP_lit7");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_360,0x37);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_370,(char (*) [11])"DW_OP_lit8");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_370,0x38);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_380,(char (*) [11])"DW_OP_lit9");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_380,0x39);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_390,(char (*) [12])"DW_OP_lit10");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_390,0x3a);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3a0,(char (*) [12])"DW_OP_lit11");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3a0,0x3b);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3b0,(char (*) [12])"DW_OP_lit12");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3b0,0x3c);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3c0,(char (*) [12])"DW_OP_lit13");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3c0,0x3d);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3d0,(char (*) [12])"DW_OP_lit14");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3d0,0x3e);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3e0,(char (*) [12])"DW_OP_lit15");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3e0,0x3f);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_3f0,(char (*) [12])"DW_OP_lit16");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_3f0,0x40);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_400,(char (*) [12])"DW_OP_lit17");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_400,0x41);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_410,(char (*) [12])"DW_OP_lit18");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_410,0x42);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_420,(char (*) [12])"DW_OP_lit19");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_420,0x43);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_430,(char (*) [12])"DW_OP_lit20");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_430,0x44);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_440,(char (*) [12])"DW_OP_lit21");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_440,0x45);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_450,(char (*) [12])"DW_OP_lit22");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_450,0x46);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_460,(char (*) [12])"DW_OP_lit23");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_460,0x47);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_470,(char (*) [12])"DW_OP_lit24");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_470,0x48);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_480,(char (*) [12])"DW_OP_lit25");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_480,0x49);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_490,(char (*) [12])"DW_OP_lit26");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_490,0x4a);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_4a0,(char (*) [12])"DW_OP_lit27");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4a0,0x4b);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_4b0,(char (*) [12])"DW_OP_lit28");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4b0,0x4c);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_4c0,(char (*) [12])"DW_OP_lit29");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4c0,0x4d);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_4d0,(char (*) [12])"DW_OP_lit30");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4d0,0x4e);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_4e0,(char (*) [12])"DW_OP_lit31");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4e0,0x4f);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_4f0,(char (*) [11])"DW_OP_reg0");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_4f0,0x50);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_500,(char (*) [11])"DW_OP_reg1");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_500,0x51);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_510,(char (*) [11])"DW_OP_reg2");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_510,0x52);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_520,(char (*) [11])"DW_OP_reg3");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_520,0x53);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_530,(char (*) [11])"DW_OP_reg4");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_530,0x54);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_540,(char (*) [11])"DW_OP_reg5");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_540,0x55);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_550,(char (*) [11])"DW_OP_reg6");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_550,0x56);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_560,(char (*) [11])"DW_OP_reg7");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_560,0x57);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_570,(char (*) [11])"DW_OP_reg8");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_570,0x58);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_580,(char (*) [11])"DW_OP_reg9");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_580,0x59);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_590,(char (*) [12])"DW_OP_reg10");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_590,0x5a);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5a0,(char (*) [12])"DW_OP_reg11");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5a0,0x5b);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5b0,(char (*) [12])"DW_OP_reg12");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5b0,0x5c);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5c0,(char (*) [12])"DW_OP_reg13");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5c0,0x5d);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5d0,(char (*) [12])"DW_OP_reg14");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5d0,0x5e);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5e0,(char (*) [12])"DW_OP_reg15");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5e0,0x5f);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_5f0,(char (*) [12])"DW_OP_reg16");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_5f0,0x60);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_600,(char (*) [12])"DW_OP_reg17");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_600,0x61);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_610,(char (*) [12])"DW_OP_reg18");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_610,0x62);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_620,(char (*) [12])"DW_OP_reg19");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_620,99);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_630,(char (*) [12])"DW_OP_reg20");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_630,100);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_640,(char (*) [12])"DW_OP_reg21");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_640,0x65);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_650,(char (*) [12])"DW_OP_reg22");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_650,0x66);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_660,(char (*) [12])"DW_OP_reg23");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_660,0x67);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_670,(char (*) [12])"DW_OP_reg24");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_670,0x68);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_680,(char (*) [12])"DW_OP_reg25");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_680,0x69);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_690,(char (*) [12])"DW_OP_reg26");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_690,0x6a);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6a0,(char (*) [12])"DW_OP_reg27");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6a0,0x6b);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6b0,(char (*) [12])"DW_OP_reg28");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6b0,0x6c);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6c0,(char (*) [12])"DW_OP_reg29");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6c0,0x6d);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6d0,(char (*) [12])"DW_OP_reg30");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6d0,0x6e);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6e0,(char (*) [12])"DW_OP_reg31");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6e0,0x6f);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_6f0,(char (*) [12])"DW_OP_breg0");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_6f0,0x70);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_700,(char (*) [12])"DW_OP_breg1");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_700,0x71);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_710,(char (*) [12])"DW_OP_breg2");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_710,0x72);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_720,(char (*) [12])"DW_OP_breg3");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_720,0x73);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_730,(char (*) [12])"DW_OP_breg4");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_730,0x74);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_740,(char (*) [12])"DW_OP_breg5");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_740,0x75);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_750,(char (*) [12])"DW_OP_breg6");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_750,0x76);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_760,(char (*) [12])"DW_OP_breg7");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_760,0x77);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_770,(char (*) [12])"DW_OP_breg8");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_770,0x78);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_780,(char (*) [12])"DW_OP_breg9");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_780,0x79);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_790,(char (*) [13])"DW_OP_breg10");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_790,0x7a);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7a0,(char (*) [13])"DW_OP_breg11");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7a0,0x7b);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7b0,(char (*) [13])"DW_OP_breg12");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7b0,0x7c);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7c0,(char (*) [13])"DW_OP_breg13");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7c0,0x7d);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7d0,(char (*) [13])"DW_OP_breg14");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7d0,0x7e);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7e0,(char (*) [13])"DW_OP_breg15");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7e0,0x7f);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_7f0,(char (*) [13])"DW_OP_breg16");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_7f0,0x80);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_800,(char (*) [13])"DW_OP_breg17");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_800,0x81);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_810,(char (*) [13])"DW_OP_breg18");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_810,0x82);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_820,(char (*) [13])"DW_OP_breg19");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_820,0x83);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_830,(char (*) [13])"DW_OP_breg20");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_830,0x84);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_840,(char (*) [13])"DW_OP_breg21");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_840,0x85);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_850,(char (*) [13])"DW_OP_breg22");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_850,0x86);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_860,(char (*) [13])"DW_OP_breg23");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_860,0x87);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_870,(char (*) [13])"DW_OP_breg24");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_870,0x88);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_880,(char (*) [13])"DW_OP_breg25");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_880,0x89);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_890,(char (*) [13])"DW_OP_breg26");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_890,0x8a);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_8a0,(char (*) [13])"DW_OP_breg27");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8a0,0x8b);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_8b0,(char (*) [13])"DW_OP_breg28");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8b0,0x8c);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_8c0,(char (*) [13])"DW_OP_breg29");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8c0,0x8d);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_8d0,(char (*) [13])"DW_OP_breg30");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8d0,0x8e);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_8e0,(char (*) [13])"DW_OP_breg31");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8e0,0x8f);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_8f0,(char (*) [11])"DW_OP_regx");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_8f0,0x90);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_900,(char (*) [12])"DW_OP_fbreg");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_900,0x91);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_910,(char (*) [12])"DW_OP_bregx");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_910,0x92);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_920,(char (*) [12])"DW_OP_piece");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_920,0x93);
  StringLiteral::StringLiteral<17UL>((StringLiteral *)&local_930,(char (*) [17])"DW_OP_deref_size");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_930,0x94);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_940,(char (*) [18])"DW_OP_xderef_size")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_940,0x95);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_950,(char (*) [10])"DW_OP_nop");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_950,0x96);
  StringLiteral::StringLiteral<26UL>
            ((StringLiteral *)&local_960,(char (*) [26])"DW_OP_push_object_address");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_960,0x97);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_970,(char (*) [12])"DW_OP_call2");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_970,0x98);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_980,(char (*) [12])"DW_OP_call4");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_980,0x99);
  StringLiteral::StringLiteral<15UL>((StringLiteral *)&local_990,(char (*) [15])"DW_OP_call_ref");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_990,0x9a);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_9a0,(char (*) [23])"DW_OP_form_tls_address");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9a0,0x9b);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_9b0,(char (*) [21])"DW_OP_call_frame_cfa");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9b0,0x9c);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_9c0,(char (*) [16])"DW_OP_bit_piece");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9c0,0x9d);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_9d0,(char (*) [21])"DW_OP_implicit_value");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9d0,0x9e);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_9e0,(char (*) [18])"DW_OP_stack_value")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9e0,0x9f);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_9f0,(char (*) [23])"DW_OP_implicit_pointer");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_9f0,0xa0);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_a00,(char (*) [12])"DW_OP_addrx");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a00,0xa1);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_a10,(char (*) [13])"DW_OP_constx");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a10,0xa2);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_a20,(char (*) [18])"DW_OP_entry_value")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a20,0xa3);
  StringLiteral::StringLiteral<17UL>((StringLiteral *)&local_a30,(char (*) [17])"DW_OP_const_type");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a30,0xa4);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_a40,(char (*) [18])"DW_OP_regval_type")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a40,0xa5);
  StringLiteral::StringLiteral<17UL>((StringLiteral *)&local_a50,(char (*) [17])"DW_OP_deref_type");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a50,0xa6);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_a60,(char (*) [18])"DW_OP_xderef_type")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a60,0xa7);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_a70,(char (*) [14])"DW_OP_convert");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a70,0xa8);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_a80,(char (*) [18])"DW_OP_reinterpret")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a80,0xa9);
  StringLiteral::StringLiteral<27UL>
            ((StringLiteral *)&local_a90,(char (*) [27])"DW_OP_GNU_push_tls_address");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a90,0xe0);
  StringLiteral::StringLiteral<20UL>
            ((StringLiteral *)&local_aa0,(char (*) [20])"DW_OP_WASM_location");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_aa0,0xed);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_ab0,(char (*) [22])"DW_OP_GNU_entry_value");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_ab0,0xf3);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_ac0,(char (*) [21])"DW_OP_GNU_addr_index");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_ac0,0xfb);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_ad0,(char (*) [22])"DW_OP_GNU_const_index");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_ad0,0xfc);
  StringLiteral::StringLiteral<19UL>
            ((StringLiteral *)&local_ae0,(char (*) [19])"DW_OP_LLVM_convert");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_ae0,0x1001);
  StringLiteral::StringLiteral<20UL>
            ((StringLiteral *)&local_af0,(char (*) [20])"DW_OP_LLVM_fragment");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_af0,0x1000);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_b00,(char (*) [22])"DW_OP_LLVM_tag_offset");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_b00,0x1002);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_b10,(char (*) [23])"DW_OP_LLVM_entry_value");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_b10,0x1003);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getOperationEncoding(StringRef OperationEncodingString) {
  return StringSwitch<unsigned>(OperationEncodingString)
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  .Case("DW_OP_" #NAME, DW_OP_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Case("DW_OP_LLVM_convert", DW_OP_LLVM_convert)
      .Case("DW_OP_LLVM_fragment", DW_OP_LLVM_fragment)
      .Case("DW_OP_LLVM_tag_offset", DW_OP_LLVM_tag_offset)
      .Case("DW_OP_LLVM_entry_value", DW_OP_LLVM_entry_value)
      .Default(0);
}